

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# usbcam.h
# Opt level: O1

void __thiscall ImgClass::~ImgClass(ImgClass *this)

{
  pointer pcVar1;
  
  if (this->data != (uchar *)0x0) {
    operator_delete__(this->data);
  }
  this->data = (uchar *)0x0;
  pcVar1 = (this->name)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->name).field_2) {
    operator_delete(pcVar1);
    return;
  }
  return;
}

Assistant:

~ImgClass() {
        delete []data;
        data = NULL;
    }